

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

LY_ERR lys_eval_iffeatures(ly_ctx *ctx,lysp_qname *iffeatures,ly_bool *enabled)

{
  LY_ERR LVar1;
  lysp_feature **local_80;
  undefined1 auStack_68 [4];
  LY_ERR ret__;
  lysf_ctx fctx;
  lysc_iffeature iff;
  uint64_t u;
  LY_ERR ret;
  ly_bool *enabled_local;
  lysp_qname *iffeatures_local;
  ly_ctx *ctx_local;
  
  memset(auStack_68,0,0x20);
  *enabled = '\x01';
  if (iffeatures != (lysp_qname *)0x0) {
    iff.features = (lysp_feature **)0x0;
    _auStack_68 = ctx;
    while( true ) {
      if (iffeatures == (lysp_qname *)0x0) {
        local_80 = (lysp_feature **)0x0;
      }
      else {
        local_80 = *(lysp_feature ***)&iffeatures[-1].flags;
      }
      if (local_80 <= iff.features) {
        return LY_SUCCESS;
      }
      memset(&fctx.ext_set.field_2,0,0x10);
      LVar1 = lys_compile_iffeature
                        (ctx,iffeatures + (long)iff.features,(lysc_iffeature *)&fctx.ext_set.field_2
                        );
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      LVar1 = lysc_iffeature_value((lysc_iffeature *)&fctx.ext_set.field_2);
      lysc_iffeature_free((lysf_ctx *)auStack_68,(lysc_iffeature *)&fctx.ext_set.field_2);
      if (LVar1 == LY_ENOT) break;
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      iff.features = (lysp_feature **)((long)iff.features + 1);
    }
    *enabled = '\0';
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_eval_iffeatures(const struct ly_ctx *ctx, const struct lysp_qname *iffeatures, ly_bool *enabled)
{
    LY_ERR ret;
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_iffeature iff;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};

    /* enabled by default */
    *enabled = 1;

    if (!iffeatures) {
        return LY_SUCCESS;
    }

    /* evaluate all if-feature conditions or until an unsatisfied one is found */
    LY_ARRAY_FOR(iffeatures, u) {
        memset(&iff, 0, sizeof iff);
        LY_CHECK_RET(lys_compile_iffeature(ctx, &iffeatures[u], &iff));

        ret = lysc_iffeature_value(&iff);
        lysc_iffeature_free(&fctx, &iff);
        if (ret == LY_ENOT) {
            *enabled = 0;
            break;
        } else if (ret) {
            return ret;
        }
    }

    return LY_SUCCESS;
}